

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall
QListWidgetItem::QListWidgetItem
          (QListWidgetItem *this,QIcon *icon,QString *text,QListWidget *listview,int type)

{
  QFlags<Qt::ItemFlag> QVar1;
  QListWidgetItemPrivate *o;
  QListModel *pQVar2;
  QListWidget *in_RCX;
  QString *in_RDX;
  QListWidgetItem *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QListModel *model;
  QSignalBlocker bm;
  QSignalBlocker b;
  QListWidgetItem *in_stack_ffffffffffffff28;
  ItemFlag other;
  QListWidgetItem *in_stack_ffffffffffffff30;
  QListModel *pQVar3;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 local_88 [24];
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_70;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_6c;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  int row;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_00d2f268;
  in_RDI->rtti = in_R8D;
  in_RDI->view = in_RCX;
  o = (QListWidgetItemPrivate *)operator_new(0x28);
  QListWidgetItemPrivate::QListWidgetItemPrivate
            ((QListWidgetItemPrivate *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  other = (ItemFlag)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  in_RDI->d = o;
  local_70.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (enum_type)in_stack_ffffffffffffff30);
  local_6c.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff30,other);
  QVar1 = QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffff30,other);
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar1.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  pQVar2 = listModel(in_stack_ffffffffffffff30);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)in_RDI,(QObject *)o);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)in_RDI,(QObject *)o);
  ::QVariant::QVariant(&local_28,in_RDX);
  (**(code **)((QObject *)in_RDI->_vptr_QListWidgetItem + 0x20))(in_RDI,0,&local_28);
  ::QVariant::~QVariant(&local_28);
  QIcon::operator_cast_to_QVariant((QIcon *)&local_48);
  (**(code **)((QObject *)in_RDI->_vptr_QListWidgetItem + 0x20))(in_RDI,1,&local_48);
  ::QVariant::~QVariant(&local_48);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_ffffffffffffff30);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_ffffffffffffff30);
  if (pQVar2 != (QListModel *)0x0) {
    pQVar3 = pQVar2;
    QModelIndex::QModelIndex((QModelIndex *)0x89bf43);
    row = (int)((ulong)pQVar3 >> 0x20);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,local_88);
    QListModel::insert((QListModel *)CONCAT44(in_R8D,in_stack_ffffffffffffff50),row,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem::QListWidgetItem(const QIcon &icon,const QString &text,
                                 QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    QListModel *model = listModel();
    {
        QSignalBlocker b(view);
        QSignalBlocker bm(model);
        setData(Qt::DisplayRole, text);
        setData(Qt::DecorationRole, icon);
    }
    if (model)
        model->insert(model->rowCount(), this);
}